

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_sender.c
# Opt level: O3

SEND_ONE_MESSAGE_RESULT
send_one_message(MESSAGE_SENDER_INSTANCE *message_sender,ASYNC_OPERATION_HANDLE pending_send,
                MESSAGE_HANDLE message)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  int iVar4;
  LOGGER_LOG p_Var5;
  AMQP_VALUE value;
  AMQP_VALUE pAVar6;
  AMQP_VALUE value_00;
  ASYNC_OPERATION_HANDLE pAVar7;
  ulong uVar8;
  char *pcVar9;
  size_t sVar10;
  SEND_ONE_MESSAGE_RESULT SVar11;
  data value_01;
  data value_02;
  size_t encoded_size;
  AMQP_VALUE message_body_amqp_value;
  size_t body_data_count;
  MESSAGE_BODY_TYPE message_body_type;
  AMQP_VALUE msg_annotations;
  AMQP_VALUE application_properties;
  PROPERTIES_HANDLE properties;
  message_format message_format;
  HEADER_HANDLE header;
  BINARY_DATA binary_data_1;
  undefined8 in_stack_ffffffffffffff28;
  undefined4 uVar12;
  size_t local_b8;
  AMQP_VALUE local_b0;
  AMQP_VALUE local_a8;
  size_t local_a0;
  BINARY_DATA local_98;
  size_t local_88;
  MESSAGE_BODY_TYPE local_7c;
  annotations local_78;
  AMQP_VALUE local_70;
  PROPERTIES_HANDLE local_68;
  message_format local_5c;
  HEADER_HANDLE local_58;
  BINARY_DATA local_50;
  AMQP_VALUE local_40;
  AMQP_VALUE local_38;
  
  iVar4 = message_get_body_type(message,&local_7c);
  if ((iVar4 != 0) || (iVar4 = message_get_message_format(message,&local_5c), iVar4 != 0)) {
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 != (LOGGER_LOG)0x0) {
      (*p_Var5)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                ,"send_one_message",0xe4,1,"Failure getting message body type and/or message format"
               );
      return SEND_ONE_MESSAGE_ERROR;
    }
    return SEND_ONE_MESSAGE_ERROR;
  }
  value = (AMQP_VALUE)0x0;
  local_58 = (HEADER_HANDLE)0x0;
  local_68 = (PROPERTIES_HANDLE)0x0;
  local_70 = (AMQP_VALUE)0x0;
  local_88 = 0;
  local_78 = (AMQP_VALUE)0x0;
  iVar4 = message_get_header(message,&local_58);
  local_b8 = 0;
  if (local_58 == (HEADER_HANDLE)0x0 || iVar4 != 0) {
LAB_001551a2:
    iVar4 = message_get_message_annotations(message,&local_78);
    if (local_78 != (AMQP_VALUE)0x0 && iVar4 == 0) {
      iVar4 = amqpvalue_get_encoded_size(local_78,&local_a0);
      if (iVar4 != 0) {
        p_Var5 = xlogging_get_log_function();
        if (p_Var5 != (LOGGER_LOG)0x0) {
          pcVar9 = "Cannot obtain message annotations encoded size";
          iVar4 = 0x115;
          goto LAB_001553d5;
        }
        goto LAB_001553f6;
      }
      local_b8 = local_b8 + local_a0;
    }
    iVar4 = message_get_properties(message,&local_68);
    if (local_68 == (PROPERTIES_HANDLE)0x0 || iVar4 != 0) {
      local_b0 = (AMQP_VALUE)0x0;
LAB_001552a2:
      iVar4 = message_get_application_properties(message,&local_70);
      if (local_70 == (AMQP_VALUE)0x0 || iVar4 != 0) {
        local_a8 = (AMQP_VALUE)0x0;
LAB_0015533a:
        if (local_7c == MESSAGE_BODY_TYPE_DATA) {
          iVar4 = message_get_body_amqp_data_count(message,&local_88);
          if (iVar4 == 0) {
            if (local_88 == 0) {
              p_Var5 = xlogging_get_log_function();
              if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0015575c;
              pcVar9 = "Body data count is zero";
              iVar4 = 399;
              goto LAB_0015544d;
            }
            bVar2 = false;
            sVar10 = 0;
            do {
              iVar4 = message_get_body_amqp_data_in_place(message,sVar10,&local_98);
              if (iVar4 == 0) {
                value_01.length = (undefined4)local_98.length;
                value_01.bytes = local_98.bytes;
                value_01._12_4_ = 0;
                pAVar6 = amqpvalue_create_data(value_01);
                if (pAVar6 == (AMQP_VALUE)0x0) {
                  p_Var5 = xlogging_get_log_function();
                  if (p_Var5 == (LOGGER_LOG)0x0) {
                    bVar2 = true;
                  }
                  else {
                    bVar2 = true;
                    (*p_Var5)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                              ,"send_one_message",0x1a4,1,"Cannot create body AMQP data");
                  }
                }
                else {
                  iVar4 = amqpvalue_get_encoded_size(pAVar6,&local_a0);
                  if (iVar4 == 0) {
                    local_b8 = local_b8 + local_a0;
                  }
                  else {
                    p_Var5 = xlogging_get_log_function();
                    if (p_Var5 == (LOGGER_LOG)0x0) {
                      bVar2 = true;
                    }
                    else {
                      bVar2 = true;
                      (*p_Var5)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                                ,"send_one_message",0x1ab,1,"Cannot get body AMQP data encoded size"
                               );
                    }
                  }
                  amqpvalue_destroy(pAVar6);
                }
              }
              else {
                p_Var5 = xlogging_get_log_function();
                if (p_Var5 == (LOGGER_LOG)0x0) {
                  bVar2 = true;
                }
                else {
                  in_stack_ffffffffffffff28 =
                       CONCAT44((int)((ulong)in_stack_ffffffffffffff28 >> 0x20),(int)sVar10);
                  bVar2 = true;
                  (*p_Var5)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                            ,"send_one_message",0x198,1,"Cannot get body AMQP data %u",
                            in_stack_ffffffffffffff28);
                }
              }
              sVar10 = sVar10 + 1;
            } while (sVar10 < local_88);
          }
          else {
            p_Var5 = xlogging_get_log_function();
            if (p_Var5 != (LOGGER_LOG)0x0) {
              pcVar9 = "Cannot get body AMQP data count";
              iVar4 = 0x188;
              goto LAB_0015544d;
            }
LAB_0015575c:
            bVar2 = true;
          }
LAB_00155764:
          pAVar6 = (AMQP_VALUE)0x0;
        }
        else {
          if (local_7c != MESSAGE_BODY_TYPE_VALUE) {
            p_Var5 = xlogging_get_log_function();
            if (p_Var5 != (LOGGER_LOG)0x0) {
              pcVar9 = "Unknown body type";
              iVar4 = 0x15c;
              goto LAB_00155490;
            }
            goto LAB_00155777;
          }
          iVar4 = message_get_body_amqp_value_in_place(message,(AMQP_VALUE *)&local_98);
          if (iVar4 != 0) {
            p_Var5 = xlogging_get_log_function();
            if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0015575c;
            pcVar9 = "Cannot obtain AMQP value from body";
            iVar4 = 0x165;
LAB_0015544d:
            bVar2 = true;
            (*p_Var5)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                      ,"send_one_message",iVar4,1,pcVar9);
            goto LAB_00155764;
          }
          pAVar6 = amqpvalue_create_amqp_value((AMQP_VALUE)local_98.bytes);
          if (pAVar6 == (AMQP_VALUE)0x0) {
            p_Var5 = xlogging_get_log_function();
            if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0015575c;
            pcVar9 = "Cannot create body AMQP value";
            iVar4 = 0x16d;
            goto LAB_0015544d;
          }
          iVar4 = amqpvalue_get_encoded_size(pAVar6,&local_a0);
          if (iVar4 == 0) {
            local_b8 = local_b8 + local_a0;
            bVar2 = false;
          }
          else {
            p_Var5 = xlogging_get_log_function();
            if (p_Var5 == (LOGGER_LOG)0x0) {
              bVar2 = true;
            }
            else {
              bVar2 = true;
              (*p_Var5)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                        ,"send_one_message",0x174,1,"Cannot get body AMQP value encoded size");
            }
          }
        }
        if (!bVar2) {
          local_98.bytes = (uchar *)malloc(local_b8);
          local_98.length._0_4_ = 0;
          local_98.length._4_4_ = 0;
          local_38 = (AMQP_VALUE)local_98.bytes;
          if (local_58 == (HEADER_HANDLE)0x0) {
            bVar2 = false;
          }
          else {
            iVar4 = amqpvalue_encode(value,encode_bytes,&local_98);
            if (iVar4 == 0) {
              bVar2 = false;
            }
            else {
              p_Var5 = xlogging_get_log_function();
              if (p_Var5 == (LOGGER_LOG)0x0) {
                bVar2 = true;
              }
              else {
                bVar2 = true;
                (*p_Var5)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                          ,"send_one_message",0x1c9,1,"Cannot encode header value");
              }
            }
            log_message_chunk(message_sender,"Header:",value);
          }
          if (local_78 != (AMQP_VALUE)0x0 && !bVar2) {
            iVar4 = amqpvalue_encode(local_78,encode_bytes,&local_98);
            if (iVar4 == 0) {
              bVar2 = false;
            }
            else {
              p_Var5 = xlogging_get_log_function();
              if (p_Var5 == (LOGGER_LOG)0x0) {
                bVar2 = true;
              }
              else {
                bVar2 = true;
                (*p_Var5)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                          ,"send_one_message",0x1d4,1,"Cannot encode message annotations value");
              }
            }
            log_message_chunk(message_sender,"Message Annotations:",local_78);
          }
          if ((!bVar2) && (local_68 != (PROPERTIES_HANDLE)0x0)) {
            iVar4 = amqpvalue_encode(local_b0,encode_bytes,&local_98);
            if (iVar4 == 0) {
              bVar2 = false;
            }
            else {
              p_Var5 = xlogging_get_log_function();
              if (p_Var5 == (LOGGER_LOG)0x0) {
                bVar2 = true;
              }
              else {
                bVar2 = true;
                (*p_Var5)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                          ,"send_one_message",0x1df,1,"Cannot encode message properties value");
              }
            }
            log_message_chunk(message_sender,"Properties:",local_b0);
          }
          if ((!bVar2) && (local_70 != (AMQP_VALUE)0x0)) {
            iVar4 = amqpvalue_encode(local_a8,encode_bytes,&local_98);
            if (iVar4 == 0) {
              bVar2 = false;
            }
            else {
              p_Var5 = xlogging_get_log_function();
              if (p_Var5 == (LOGGER_LOG)0x0) {
                bVar2 = true;
              }
              else {
                bVar2 = true;
                (*p_Var5)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                          ,"send_one_message",0x1ea,1,"Cannot encode application properties value");
              }
            }
            log_message_chunk(message_sender,"Application properties:",local_a8);
          }
          SVar11 = SEND_ONE_MESSAGE_ERROR;
          if (!bVar2) {
            if (local_7c == MESSAGE_BODY_TYPE_DATA) {
              if (local_88 == 0) {
                bVar2 = false;
              }
              else {
                bVar2 = false;
                sVar10 = 0;
                do {
                  iVar4 = message_get_body_amqp_data_in_place(message,sVar10,&local_50);
                  if (iVar4 == 0) {
                    value_02._4_8_ = local_50._4_8_;
                    value_02.bytes._0_4_ = (int)local_50.bytes;
                    value_02._12_4_ = 0;
                    value_00 = amqpvalue_create_data(value_02);
                    if (value_00 == (AMQP_VALUE)0x0) {
                      p_Var5 = xlogging_get_log_function();
                      if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_00155c05;
                      uVar12 = (undefined4)((ulong)in_stack_ffffffffffffff28 >> 0x20);
                      iVar4 = 0x21a;
                      pcVar9 = "Cannot create body AMQP data %u";
                      goto LAB_00155b6f;
                    }
                    local_40 = value_00;
                    iVar4 = amqpvalue_encode(value_00,encode_bytes,&local_98);
                    uVar12 = (undefined4)((ulong)in_stack_ffffffffffffff28 >> 0x20);
                    if (iVar4 != 0) {
                      p_Var5 = xlogging_get_log_function();
                      if (p_Var5 == (LOGGER_LOG)0x0) {
                        bVar2 = true;
                      }
                      else {
                        bVar2 = true;
                        (*p_Var5)(AZ_LOG_ERROR,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                                  ,"send_one_message",0x221,1,"Cannot encode body AMQP data %u",
                                  CONCAT44(uVar12,(int)sVar10));
                      }
                      break;
                    }
                    amqpvalue_destroy(local_40);
                  }
                  else {
                    p_Var5 = xlogging_get_log_function();
                    if (p_Var5 == (LOGGER_LOG)0x0) {
LAB_00155c05:
                      bVar2 = true;
                    }
                    else {
                      uVar12 = (undefined4)((ulong)in_stack_ffffffffffffff28 >> 0x20);
                      iVar4 = 0x20e;
                      pcVar9 = "Cannot get AMQP data %u";
LAB_00155b6f:
                      bVar2 = true;
                      in_stack_ffffffffffffff28 = CONCAT44(uVar12,(int)sVar10);
                      (*p_Var5)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                                ,"send_one_message",iVar4,1,pcVar9,in_stack_ffffffffffffff28);
                    }
                  }
                  sVar10 = sVar10 + 1;
                } while (sVar10 < local_88);
              }
LAB_00155caa:
              if (!bVar2) {
                *(undefined4 *)&pending_send[5].async_operation_cancel_handler = 1;
                pAVar7 = link_transfer_async(message_sender->link,local_5c,(PAYLOAD *)&local_98,1,
                                             on_delivery_settled,pending_send,
                                             (LINK_TRANSFER_RESULT *)&local_50,
                                             (tickcounter_ms_t)
                                             pending_send[6].async_operation_cancel_handler);
                if (pAVar7 == (ASYNC_OPERATION_HANDLE)0x0) {
                  if ((int)local_50.bytes == 2) {
                    *(undefined4 *)&pending_send[5].async_operation_cancel_handler = 0;
                    SVar11 = SEND_ONE_MESSAGE_BUSY;
                  }
                  else {
                    p_Var5 = xlogging_get_log_function();
                    if (p_Var5 != (LOGGER_LOG)0x0) {
                      pcVar9 = "Error in link transfer";
                      iVar4 = 0x240;
                      goto LAB_00155c50;
                    }
                    SVar11 = SEND_ONE_MESSAGE_ERROR;
                  }
                }
                else {
                  uVar1 = message_sender->message_count;
                  SVar11 = SEND_ONE_MESSAGE_OK;
                  if (uVar1 != 0) {
                    if (*message_sender->messages != pending_send) {
                      uVar3 = 1;
                      do {
                        uVar8 = uVar3;
                        if (uVar1 == uVar8) break;
                        uVar3 = uVar8 + 1;
                      } while (message_sender->messages[uVar8] != pending_send);
                      if (uVar1 <= uVar8) goto LAB_00155a5e;
                    }
                    pending_send[7].async_operation_cancel_handler =
                         (ASYNC_OPERATION_CANCEL_HANDLER_FUNC)pAVar7;
                  }
                }
              }
            }
            else {
              if (local_7c == MESSAGE_BODY_TYPE_VALUE) {
                iVar4 = amqpvalue_encode(pAVar6,encode_bytes,&local_98);
                if (iVar4 == 0) {
                  bVar2 = false;
                }
                else {
                  p_Var5 = xlogging_get_log_function();
                  if (p_Var5 == (LOGGER_LOG)0x0) {
                    bVar2 = true;
                  }
                  else {
                    bVar2 = true;
                    (*p_Var5)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                              ,"send_one_message",0x1fe,1,"Cannot encode body AMQP value");
                  }
                }
                log_message_chunk(message_sender,"Body - amqp value:",pAVar6);
                goto LAB_00155caa;
              }
              p_Var5 = xlogging_get_log_function();
              if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_00155a5e;
              pcVar9 = "Unknown message type";
              iVar4 = 0x1f6;
LAB_00155c50:
              SVar11 = SEND_ONE_MESSAGE_ERROR;
              (*p_Var5)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                        ,"send_one_message",iVar4,1,pcVar9);
            }
          }
LAB_00155a5e:
          free(local_38);
          if (pAVar6 != (AMQP_VALUE)0x0) {
            amqpvalue_destroy(pAVar6);
          }
          goto LAB_0015577c;
        }
      }
      else {
        local_a8 = amqpvalue_create_application_properties(local_70);
        if (local_a8 == (AMQP_VALUE)0x0) {
          p_Var5 = xlogging_get_log_function();
          if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_001554f5;
          pcVar9 = "Cannot create application properties AMQP value";
          iVar4 = 0x13f;
          goto LAB_001554e5;
        }
        iVar4 = amqpvalue_get_encoded_size(local_a8,&local_a0);
        if (iVar4 == 0) {
          local_b8 = local_b8 + local_a0;
          goto LAB_0015533a;
        }
        p_Var5 = xlogging_get_log_function();
        if (p_Var5 != (LOGGER_LOG)0x0) {
          pcVar9 = "Cannot obtain application properties encoded size";
          iVar4 = 0x146;
LAB_00155490:
          (*p_Var5)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                    ,"send_one_message",iVar4,1,pcVar9);
        }
      }
LAB_00155777:
      SVar11 = SEND_ONE_MESSAGE_ERROR;
      goto LAB_0015577c;
    }
    local_b0 = amqpvalue_create_properties(local_68);
    if (local_b0 != (AMQP_VALUE)0x0) {
      iVar4 = amqpvalue_get_encoded_size(local_b0,&local_a0);
      if (iVar4 == 0) {
        local_b8 = local_b8 + local_a0;
        goto LAB_001552a2;
      }
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 == (LOGGER_LOG)0x0) {
LAB_001554f5:
        SVar11 = SEND_ONE_MESSAGE_ERROR;
        local_a8 = (AMQP_VALUE)0x0;
        goto LAB_0015577c;
      }
      pcVar9 = "Cannot obtain message properties encoded size";
      iVar4 = 0x12d;
LAB_001554e5:
      local_a8 = (AMQP_VALUE)0x0;
      SVar11 = SEND_ONE_MESSAGE_ERROR;
      (*p_Var5)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                ,"send_one_message",iVar4,1,pcVar9);
      goto LAB_0015577c;
    }
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 != (LOGGER_LOG)0x0) {
      pcVar9 = "Cannot create message properties AMQP value";
      iVar4 = 0x126;
      goto LAB_001553d5;
    }
  }
  else {
    value = amqpvalue_create_header(local_58);
    if (value == (AMQP_VALUE)0x0) {
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 != (LOGGER_LOG)0x0) {
        (*p_Var5)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                  ,"send_one_message",0xfc,1,"Cannot create header AMQP value");
      }
      value = (AMQP_VALUE)0x0;
    }
    else {
      iVar4 = amqpvalue_get_encoded_size(value,&local_a0);
      local_b8 = local_a0;
      if (iVar4 == 0) goto LAB_001551a2;
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_001553f6;
      pcVar9 = "Cannot obtain header encoded size";
      iVar4 = 0x103;
LAB_001553d5:
      (*p_Var5)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                ,"send_one_message",iVar4,1,pcVar9);
    }
  }
LAB_001553f6:
  local_a8 = (AMQP_VALUE)0x0;
  SVar11 = SEND_ONE_MESSAGE_ERROR;
  local_b0 = (AMQP_VALUE)0x0;
LAB_0015577c:
  if (local_58 != (HEADER_HANDLE)0x0) {
    header_destroy(local_58);
  }
  if (value != (AMQP_VALUE)0x0) {
    amqpvalue_destroy(value);
  }
  if (local_78 != (AMQP_VALUE)0x0) {
    amqpvalue_destroy(local_78);
  }
  if (local_70 != (AMQP_VALUE)0x0) {
    amqpvalue_destroy(local_70);
  }
  if (local_a8 != (AMQP_VALUE)0x0) {
    amqpvalue_destroy(local_a8);
  }
  if (local_b0 != (AMQP_VALUE)0x0) {
    amqpvalue_destroy(local_b0);
  }
  if (local_68 != (PROPERTIES_HANDLE)0x0) {
    properties_destroy(local_68);
  }
  return SVar11;
}

Assistant:

static SEND_ONE_MESSAGE_RESULT send_one_message(MESSAGE_SENDER_INSTANCE* message_sender, ASYNC_OPERATION_HANDLE pending_send, MESSAGE_HANDLE message)
{
    SEND_ONE_MESSAGE_RESULT result;

    size_t encoded_size;
    size_t total_encoded_size = 0;
    MESSAGE_BODY_TYPE message_body_type;
    message_format message_format;

    if ((message_get_body_type(message, &message_body_type) != 0) ||
        (message_get_message_format(message, &message_format) != 0))
    {
        LogError("Failure getting message body type and/or message format");
        result = SEND_ONE_MESSAGE_ERROR;
    }
    else
    {
        // header
        HEADER_HANDLE header = NULL;
        AMQP_VALUE header_amqp_value = NULL;
        PROPERTIES_HANDLE properties = NULL;
        AMQP_VALUE properties_amqp_value = NULL;
        AMQP_VALUE application_properties = NULL;
        AMQP_VALUE application_properties_value = NULL;
        AMQP_VALUE body_amqp_value = NULL;
        size_t body_data_count = 0;
        AMQP_VALUE msg_annotations = NULL;
        bool is_error = false;

        // message header
        if ((message_get_header(message, &header) == 0) &&
            (header != NULL))
        {
            header_amqp_value = amqpvalue_create_header(header);
            if (header_amqp_value == NULL)
            {
                LogError("Cannot create header AMQP value");
                is_error = true;
            }
            else
            {
                if (amqpvalue_get_encoded_size(header_amqp_value, &encoded_size) != 0)
                {
                    LogError("Cannot obtain header encoded size");
                    is_error = true;
                }
                else
                {
                    total_encoded_size += encoded_size;
                }
            }

        }

        // message annotations
        if ((!is_error) &&
            (message_get_message_annotations(message, &msg_annotations) == 0) &&
            (msg_annotations != NULL))
        {
            if (amqpvalue_get_encoded_size(msg_annotations, &encoded_size) != 0)
            {
                LogError("Cannot obtain message annotations encoded size");
                is_error = true;
            }
            else
            {
                total_encoded_size += encoded_size;
            }
        }

        // properties
        if ((!is_error) &&
            (message_get_properties(message, &properties) == 0) &&
            (properties != NULL))
        {
            properties_amqp_value = amqpvalue_create_properties(properties);
            if (properties_amqp_value == NULL)
            {
                LogError("Cannot create message properties AMQP value");
                is_error = true;
            }
            else
            {
                if (amqpvalue_get_encoded_size(properties_amqp_value, &encoded_size) != 0)
                {
                    LogError("Cannot obtain message properties encoded size");
                    is_error = true;
                }
                else
                {
                    total_encoded_size += encoded_size;
                }
            }
        }

        // application properties
        if ((!is_error) &&
            (message_get_application_properties(message, &application_properties) == 0) &&
            (application_properties != NULL))
        {
            application_properties_value = amqpvalue_create_application_properties(application_properties);
            if (application_properties_value == NULL)
            {
                LogError("Cannot create application properties AMQP value");
                is_error = true;
            }
            else
            {
                if (amqpvalue_get_encoded_size(application_properties_value, &encoded_size) != 0)
                {
                    LogError("Cannot obtain application properties encoded size");
                    is_error = true;
                }
                else
                {
                    total_encoded_size += encoded_size;
                }
            }
        }

        if (is_error)
        {
            result = SEND_ONE_MESSAGE_ERROR;
        }
        else
        {
            result = SEND_ONE_MESSAGE_OK;

            // body - amqp data
            switch (message_body_type)
            {
            default:
                LogError("Unknown body type");
                result = SEND_ONE_MESSAGE_ERROR;
                break;

            case MESSAGE_BODY_TYPE_VALUE:
            {
                AMQP_VALUE message_body_amqp_value;
                if (message_get_body_amqp_value_in_place(message, &message_body_amqp_value) != 0)
                {
                    LogError("Cannot obtain AMQP value from body");
                    result = SEND_ONE_MESSAGE_ERROR;
                }
                else
                {
                    body_amqp_value = amqpvalue_create_amqp_value(message_body_amqp_value);
                    if (body_amqp_value == NULL)
                    {
                        LogError("Cannot create body AMQP value");
                        result = SEND_ONE_MESSAGE_ERROR;
                    }
                    else
                    {
                        if (amqpvalue_get_encoded_size(body_amqp_value, &encoded_size) != 0)
                        {
                            LogError("Cannot get body AMQP value encoded size");
                            result = SEND_ONE_MESSAGE_ERROR;
                        }
                        else
                        {
                            total_encoded_size += encoded_size;
                        }
                    }
                }

                break;
            }

            case MESSAGE_BODY_TYPE_DATA:
            {
                BINARY_DATA binary_data;
                size_t i;

                if (message_get_body_amqp_data_count(message, &body_data_count) != 0)
                {
                    LogError("Cannot get body AMQP data count");
                    result = SEND_ONE_MESSAGE_ERROR;
                }
                else
                {
                    if (body_data_count == 0)
                    {
                        LogError("Body data count is zero");
                        result = SEND_ONE_MESSAGE_ERROR;
                    }
                    else
                    {
                        for (i = 0; i < body_data_count; i++)
                        {
                            if (message_get_body_amqp_data_in_place(message, i, &binary_data) != 0)
                            {
                                LogError("Cannot get body AMQP data %u", (unsigned int)i);
                                result = SEND_ONE_MESSAGE_ERROR;
                            }
                            else
                            {
                                AMQP_VALUE body_amqp_data;
                                amqp_binary binary_value;
                                binary_value.bytes = binary_data.bytes;
                                binary_value.length = (uint32_t)binary_data.length;
                                body_amqp_data = amqpvalue_create_data(binary_value);
                                if (body_amqp_data == NULL)
                                {
                                    LogError("Cannot create body AMQP data");
                                    result = SEND_ONE_MESSAGE_ERROR;
                                }
                                else
                                {
                                    if (amqpvalue_get_encoded_size(body_amqp_data, &encoded_size) != 0)
                                    {
                                        LogError("Cannot get body AMQP data encoded size");
                                        result = SEND_ONE_MESSAGE_ERROR;
                                    }
                                    else
                                    {
                                        total_encoded_size += encoded_size;
                                    }

                                    amqpvalue_destroy(body_amqp_data);
                                }
                            }
                        }
                    }
                }
                break;
            }
            }

            if (result == 0)
            {
                void* data_bytes = malloc(total_encoded_size);
                PAYLOAD payload;
                payload.bytes = (const unsigned char*)data_bytes;
                payload.length = 0;
                result = SEND_ONE_MESSAGE_OK;

                if (header != NULL)
                {
                    if (amqpvalue_encode(header_amqp_value, encode_bytes, &payload) != 0)
                    {
                        LogError("Cannot encode header value");
                        result = SEND_ONE_MESSAGE_ERROR;
                    }

                    log_message_chunk(message_sender, "Header:", header_amqp_value);
                }

                if ((result == SEND_ONE_MESSAGE_OK) && (msg_annotations != NULL))
                {
                    if (amqpvalue_encode(msg_annotations, encode_bytes, &payload) != 0)
                    {
                        LogError("Cannot encode message annotations value");
                        result = SEND_ONE_MESSAGE_ERROR;
                    }

                    log_message_chunk(message_sender, "Message Annotations:", msg_annotations);
                }

                if ((result == SEND_ONE_MESSAGE_OK) && (properties != NULL))
                {
                    if (amqpvalue_encode(properties_amqp_value, encode_bytes, &payload) != 0)
                    {
                        LogError("Cannot encode message properties value");
                        result = SEND_ONE_MESSAGE_ERROR;
                    }

                    log_message_chunk(message_sender, "Properties:", properties_amqp_value);
                }

                if ((result == SEND_ONE_MESSAGE_OK) && (application_properties != NULL))
                {
                    if (amqpvalue_encode(application_properties_value, encode_bytes, &payload) != 0)
                    {
                        LogError("Cannot encode application properties value");
                        result = SEND_ONE_MESSAGE_ERROR;
                    }

                    log_message_chunk(message_sender, "Application properties:", application_properties_value);
                }

                if (result == SEND_ONE_MESSAGE_OK)
                {
                    switch (message_body_type)
                    {
                    default:
                        LogError("Unknown message type");
                        result = SEND_ONE_MESSAGE_ERROR;
                        break;

                    case MESSAGE_BODY_TYPE_VALUE:
                    {
                        if (amqpvalue_encode(body_amqp_value, encode_bytes, &payload) != 0)
                        {
                            LogError("Cannot encode body AMQP value");
                            result = SEND_ONE_MESSAGE_ERROR;
                        }

                        log_message_chunk(message_sender, "Body - amqp value:", body_amqp_value);
                        break;
                    }
                    case MESSAGE_BODY_TYPE_DATA:
                    {
                        BINARY_DATA binary_data;
                        size_t i;

                        for (i = 0; i < body_data_count; i++)
                        {
                            if (message_get_body_amqp_data_in_place(message, i, &binary_data) != 0)
                            {
                                LogError("Cannot get AMQP data %u", (unsigned int)i);
                                result = SEND_ONE_MESSAGE_ERROR;
                            }
                            else
                            {
                                AMQP_VALUE body_amqp_data;
                                amqp_binary binary_value;
                                binary_value.bytes = binary_data.bytes;
                                binary_value.length = (uint32_t)binary_data.length;
                                body_amqp_data = amqpvalue_create_data(binary_value);
                                if (body_amqp_data == NULL)
                                {
                                    LogError("Cannot create body AMQP data %u", (unsigned int)i);
                                    result = SEND_ONE_MESSAGE_ERROR;
                                }
                                else
                                {
                                    if (amqpvalue_encode(body_amqp_data, encode_bytes, &payload) != 0)
                                    {
                                        LogError("Cannot encode body AMQP data %u", (unsigned int)i);
                                        result = SEND_ONE_MESSAGE_ERROR;
                                        break;
                                    }

                                    amqpvalue_destroy(body_amqp_data);
                                }
                            }
                        }
                        break;
                    }
                    }
                }

                if (result == SEND_ONE_MESSAGE_OK)
                {
                    ASYNC_OPERATION_HANDLE transfer_async_operation;
                    LINK_TRANSFER_RESULT link_transfer_error;
                    MESSAGE_WITH_CALLBACK* message_with_callback = GET_ASYNC_OPERATION_CONTEXT(MESSAGE_WITH_CALLBACK, pending_send);
                    message_with_callback->message_send_state = MESSAGE_SEND_STATE_PENDING;

                    transfer_async_operation = link_transfer_async(message_sender->link, message_format, &payload, 1, on_delivery_settled, pending_send, &link_transfer_error, message_with_callback->timeout);
                    if (transfer_async_operation == NULL)
                    {
                        if (link_transfer_error == LINK_TRANSFER_BUSY)
                        {
                            message_with_callback->message_send_state = MESSAGE_SEND_STATE_NOT_SENT;
                            result = SEND_ONE_MESSAGE_BUSY;
                        }
                        else
                        {
                            LogError("Error in link transfer");
                            result = SEND_ONE_MESSAGE_ERROR;
                        }
                    }
                    else
                    {
                        // For messages that get atomically sent and settled by link_transfer_async,
                        // on_delivery_settled is invoked and the message destroyed.
                        // So at this point we shall verify if the message still exists and is in the queue.
                        if (is_message_in_queue(message_sender, pending_send))
                        {
                            message_with_callback->transfer_async_operation = transfer_async_operation;
                        }

                        result = SEND_ONE_MESSAGE_OK;
                    }
                }

                free(data_bytes);

                if (body_amqp_value != NULL)
                {
                    amqpvalue_destroy(body_amqp_value);
                }
            }
        }

        if (header != NULL)
        {
            header_destroy(header);
        }

        if (header_amqp_value != NULL)
        {
            amqpvalue_destroy(header_amqp_value);
        }

        if (msg_annotations != NULL)
        {
            annotations_destroy(msg_annotations);
        }

        if (application_properties != NULL)
        {
            amqpvalue_destroy(application_properties);
        }

        if (application_properties_value != NULL)
        {
            amqpvalue_destroy(application_properties_value);
        }

        if (properties_amqp_value != NULL)
        {
            amqpvalue_destroy(properties_amqp_value);
        }

        if (properties != NULL)
        {
            properties_destroy(properties);
        }
    }

    return result;
}